

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_writer.cpp
# Opt level: O2

unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true> __thiscall
duckdb::TableDataWriter::CreateTaskExecutor(TableDataWriter *this)

{
  ClientContext *args;
  DatabaseInstance *db;
  TaskScheduler *args_00;
  TableDataWriter *in_RSI;
  
  if ((in_RSI->client_context).ptr == (ClientContext *)0x0) {
    db = GetDatabase(in_RSI);
    args_00 = TaskScheduler::GetScheduler(db);
    make_uniq<duckdb::TaskExecutor,duckdb::TaskScheduler&>((duckdb *)this,args_00);
  }
  else {
    args = optional_ptr<duckdb::ClientContext,_true>::operator*(&in_RSI->client_context);
    make_uniq<duckdb::TaskExecutor,duckdb::ClientContext&>((duckdb *)this,args);
  }
  return (unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>_>)
         (unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>_>)this;
}

Assistant:

unique_ptr<TaskExecutor> TableDataWriter::CreateTaskExecutor() {
	if (client_context) {
		return make_uniq<TaskExecutor>(*client_context);
	}
	return make_uniq<TaskExecutor>(TaskScheduler::GetScheduler(GetDatabase()));
}